

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

void gotcha_assert_fail(char *s,char *file,uint line,char *function)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char linestr [64];
  
  iVar1 = ulong_to_str((ulong)line,linestr,0x3f);
  if (iVar1 == -1) {
    linestr[0] = '\0';
  }
  sVar3 = gotcha_strlen(file);
  gotcha_write(2,file,sVar3);
  gotcha_write(2,":",1);
  sVar3 = gotcha_strlen(linestr);
  gotcha_write(2,linestr,sVar3);
  gotcha_write(2,": ",2);
  sVar3 = gotcha_strlen(function);
  gotcha_write(2,function,sVar3);
  gotcha_write(2,": Assertion `",0xd);
  sVar3 = gotcha_strlen(s);
  gotcha_write(2,s,sVar3);
  gotcha_write(2,"\' failed.\n",10);
  uVar2 = gotcha_getpid();
  syscall(0x3e,(ulong)uVar2,6);
  return;
}

Assistant:

void gotcha_assert_fail(const char *s, const char *file, unsigned int line, const char *function)
{
   char linestr[64];
   int result;

   result = ulong_to_str(line, linestr, sizeof(linestr)-1);
   if (result == -1)
      linestr[0] = '\0';

   gotcha_write(2, file, gotcha_strlen(file));
   gotcha_write(2, ":", 1);
   gotcha_write(2, linestr, gotcha_strlen(linestr));
   gotcha_write(2, ": ", 2);
   gotcha_write(2, function, gotcha_strlen(function));
   gotcha_write(2, ": Assertion `", 13);
   gotcha_write(2, s, gotcha_strlen(s));
   gotcha_write(2, "' failed.\n", 10);
   syscall(SYS_kill, gotcha_getpid(), SIGABRT);
}